

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

GLuint deqp::gls::FboUtil::config::glCreate(Image *cfg,Functions *gl)

{
  glBindTextureFunc p_Var1;
  GLenum GVar2;
  long lVar3;
  Image *img;
  Image *img_00;
  TextureFlat *cfg_00;
  TextureLayered *cfg_01;
  GLint depth_divider;
  GLuint ret;
  GLuint local_2c;
  
  local_2c = 0;
  lVar3 = __dynamic_cast(cfg,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  if (lVar3 != 0) {
    (*gl->genRenderbuffers)(1,&local_2c);
    (*gl->bindRenderbuffer)(0x8d41,local_2c);
    if (*(int *)(lVar3 + 0x18) == 0) {
      (*gl->renderbufferStorage)
                (0x8d41,*(GLenum *)(lVar3 + 8),*(GLsizei *)(lVar3 + 0x10),*(GLsizei *)(lVar3 + 0x14)
                );
    }
    else {
      (*gl->renderbufferStorageMultisample)
                (0x8d41,*(int *)(lVar3 + 0x18),*(GLenum *)(lVar3 + 8),*(GLsizei *)(lVar3 + 0x10),
                 *(GLsizei *)(lVar3 + 0x14));
    }
    (*gl->bindRenderbuffer)(0x8d41,0);
    return local_2c;
  }
  img = (Image *)__dynamic_cast(cfg,&Image::typeinfo,&Texture::typeinfo,0);
  if (img == (Image *)0x0) {
    return local_2c;
  }
  (*gl->genTextures)(1,&local_2c);
  p_Var1 = gl->bindTexture;
  GVar2 = glTarget(img);
  (*p_Var1)(GVar2,local_2c);
  img_00 = (Image *)__dynamic_cast(img,&Texture::typeinfo,&Texture2D::typeinfo,0);
  if (img_00 == (Image *)0x0) {
    cfg_00 = (TextureFlat *)__dynamic_cast(img,&Texture::typeinfo,&TextureCubeMap::typeinfo,0);
    if (cfg_00 == (TextureFlat *)0x0) {
      cfg_01 = (TextureLayered *)__dynamic_cast(img,&Texture::typeinfo,&Texture3D::typeinfo,0);
      if (cfg_01 == (TextureLayered *)0x0) {
        cfg_01 = (TextureLayered *)
                 __dynamic_cast(img,&Texture::typeinfo,&Texture2DArray::typeinfo,0);
        if (cfg_01 == (TextureLayered *)0x0) goto LAB_017f1ee1;
        depth_divider = 1;
      }
      else {
        depth_divider = 2;
      }
      glInitLayered(cfg_01,depth_divider,gl);
    }
    else {
      lVar3 = 0;
      do {
        glInitFlat(cfg_00,*(GLenum *)
                           ((long)&glInit(deqp::gls::FboUtil::config::Texture_const&,glw::Functions_const&)
                                   ::s_cubeMapFaces + lVar3),gl);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x18);
    }
  }
  else {
    GVar2 = glTarget(img_00);
    glInitFlat((TextureFlat *)img_00,GVar2,gl);
  }
LAB_017f1ee1:
  p_Var1 = gl->bindTexture;
  GVar2 = glTarget(img);
  (*p_Var1)(GVar2,0);
  return local_2c;
}

Assistant:

static GLuint glCreate (const Image& cfg, const glw::Functions& gl)
{
	GLuint ret = 0;
	if (const Renderbuffer* const rbo = dynamic_cast<const Renderbuffer*>(&cfg))
	{
		gl.genRenderbuffers(1, &ret);
		gl.bindRenderbuffer(GL_RENDERBUFFER, ret);

		if (rbo->numSamples == 0)
			gl.renderbufferStorage(GL_RENDERBUFFER, rbo->internalFormat.format,
								   rbo->width, rbo->height);
		else
			gl.renderbufferStorageMultisample(
				GL_RENDERBUFFER, rbo->numSamples, rbo->internalFormat.format,
				rbo->width, rbo->height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	}
	else if (const Texture* const tex = dynamic_cast<const Texture*>(&cfg))
	{
		gl.genTextures(1, &ret);
		gl.bindTexture(glTarget(*tex), ret);
		glInit(*tex, gl);
		gl.bindTexture(glTarget(*tex), 0);
	}
	else
		DE_FATAL("Impossible image type");
	return ret;
}